

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer pBVar1;
  char *help;
  exception *e;
  microseconds res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string_view local_30;
  unique_ptr<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>_> local_20;
  unique_ptr<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>_> measurement;
  char **argv_local;
  int argc_local;
  
  measurement._M_t.
  super___uniq_ptr_impl<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>_>._M_t
  .super__Tuple_impl<0UL,_Measurements::Benchmark_*,_std::default_delete<Measurements::Benchmark>_>.
  super__Head_base<0UL,_Measurements::Benchmark_*,_false>._M_head_impl =
       (__uniq_ptr_data<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>,_true,_true>
        )(__uniq_ptr_data<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>,_true,_true>
          )argv;
  getArgv<std::__cxx11::string>(&local_50,argc,argv,4);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  Measurements::get_measurement
            ((Measurements *)&local_20,&local_30,argc,
             (char **)measurement._M_t.
                      super___uniq_ptr_impl<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Measurements::Benchmark_*,_std::default_delete<Measurements::Benchmark>_>
                      .super__Head_base<0UL,_Measurements::Benchmark_*,_false>._M_head_impl);
  std::__cxx11::string::~string((string *)&local_50);
  pBVar1 = std::unique_ptr<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>_>::
           operator->(&local_20);
  (**pBVar1->_vptr_Benchmark)();
  std::unique_ptr<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>_>::
  ~unique_ptr(&local_20);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
try {
    auto measurement
        = Measurements::get_measurement(getArgv<std::string>(argc, argv, 4), argc, argv);
    auto res = measurement->run();
    return 0;
} catch (const std::exception& e) {
    std::cerr << e.what() << std::endl;
    const char* help = "%s <obj count> <iteration count>";
    std::printf(help, argv[0]);
    return 1;
} catch (...) {
    std::cerr << "Unknown exception\n";
    return 1;
}